

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

InsertResult __thiscall
wasm::UnorderedFixedStorage<wasm::LocalSet_*,_2UL>::insert
          (UnorderedFixedStorage<wasm::LocalSet_*,_2UL> *this,LocalSet **x)

{
  value_type pLVar1;
  size_type __n;
  reference ppLVar2;
  bool bVar3;
  ulong local_28;
  size_t i;
  LocalSet **x_local;
  UnorderedFixedStorage<wasm::LocalSet_*,_2UL> *this_local;
  
  local_28 = 0;
  while( true ) {
    if ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used <= local_28) {
      if (2 < (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used) {
        __assert_fail("this->used <= N",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                      ,0x3e,
                      "InsertResult wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>::insert(const T &) [T = wasm::LocalSet *, N = 2]"
                     );
      }
      bVar3 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used != 2;
      if (bVar3) {
        pLVar1 = *x;
        __n = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used;
        (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used = __n + 1;
        ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                            (&(this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage,__n);
        *ppLVar2 = pLVar1;
      }
      this_local._4_4_ = (InsertResult)!bVar3;
      return this_local._4_4_;
    }
    ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                        (&(this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage,local_28);
    if (*ppLVar2 == *x) break;
    local_28 = local_28 + 1;
  }
  return NoError;
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }